

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

APInt * __thiscall llvm::APInt::operator<<=(APInt *this,uint ShiftAmt)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = this->BitWidth;
  if (ShiftAmt <= uVar1) {
    if (uVar1 < 0x41) {
      lVar2 = 0;
      if (uVar1 != ShiftAmt) {
        lVar2 = (this->U).VAL << ((byte)ShiftAmt & 0x3f);
      }
      (this->U).VAL = (ulong)(lVar2 << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
    }
    else {
      shlSlowCase(this,ShiftAmt);
    }
    return this;
  }
  __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x389,"APInt &llvm::APInt::operator<<=(unsigned int)");
}

Assistant:

APInt &operator<<=(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      if (ShiftAmt == BitWidth)
        U.VAL = 0;
      else
        U.VAL <<= ShiftAmt;
      return clearUnusedBits();
    }
    shlSlowCase(ShiftAmt);
    return *this;
  }